

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_math.c
# Opt level: O2

int SUNRCompareTol(sunrealtype a,sunrealtype b,sunrealtype tol)

{
  double dVar1;
  double dVar2;
  
  if ((a == b) && (!NAN(a) && !NAN(b))) {
    return 0;
  }
  dVar1 = ABS(a + b);
  if (1.79769313486232e+308 <= dVar1) {
    dVar1 = 1.79769313486232e+308;
  }
  dVar2 = 2.220446049250313e-15;
  if (2.220446049250313e-15 <= dVar1 * tol) {
    dVar2 = dVar1 * tol;
  }
  return (int)(dVar2 <= ABS(a - b));
}

Assistant:

sunbooleantype SUNRCompareTol(sunrealtype a, sunrealtype b, sunrealtype tol)
{
  sunrealtype diff;
  sunrealtype norm;

  /* If a and b are exactly equal.
   * This also covers the case where a and b are both inf under IEEE 754.
   */
  if (a == b) { return (SUNFALSE); }

  diff = SUNRabs(a - b);
  norm = SUNMIN(SUNRabs(a + b), SUN_BIG_REAL);

  /* When |a + b| is very small (less than 10*SUN_UNIT_ROUNDOFF) or zero, we use
   * an absolute difference:
   *    |a - b| >= 10*SUN_UNIT_ROUNDOFF
   * Otherwise we use a relative difference:
   *    |a - b| < tol * |a + b|
   * The choice to use |a + b| over max(a, b) is arbitrary, as is the choice to
   * use 10*SUN_UNIT_ROUNDOFF.
   * 
   * In order to handle NANs correctly without explicit checks of isnan or
   * isunordered (which throw warnings for some compilers and flags), we use
   * !isless. The seemingly equivalent >= can have undefined behavior for NANs.
   */
  return !isless(diff, SUNMAX(10 * SUN_UNIT_ROUNDOFF, tol * norm));
}